

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O3

rt_expression_interface<double> * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  int iVar1;
  int iVar2;
  long lVar3;
  rt_expression_interface<double> *prVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  rt_expression_interface<double> *prVar5;
  ulong uVar6;
  
  lVar3 = *(long *)e;
  if (*(long *)(e + 8) != lVar3) {
    uVar6 = 0;
    do {
      iVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                        (this,*(undefined8 *)(lVar3 + uVar6 * 8));
      if ((char)iVar1 != '\0') {
        prVar5 = (rt_expression_interface<double> *)
                 (**(code **)(**(long **)(*(long *)repl + uVar6 * 8) + 0x10))();
        return prVar5;
      }
      uVar6 = uVar6 + 1;
      lVar3 = *(long *)e;
    } while (uVar6 < (ulong)(*(long *)(e + 8) - lVar3 >> 3));
  }
  prVar4 = (rt_expression_interface<double> *)operator_new(0x18);
  prVar5 = (this->expr_)._M_ptr;
  iVar1 = (*prVar5->_vptr_rt_expression_interface[0xf])(prVar5,e,repl);
  iVar2 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
  prVar4->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_unary_expr_001116c8;
  prVar4[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var,iVar1);
  prVar4[2]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar2);
  return prVar4;
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        for (std::size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        return new rt_unary_expr(expr_->substitute(e, repl),
                              op_->clone());
      }